

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O2

SampledSpectrum __thiscall
pbrt::LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f
          (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *this,Vector3f wo,
          Vector3f wi,TransportMode mode)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  BxDFFlags BVar10;
  int iVar11;
  uint64_t sequenceIndex;
  uint64_t seed;
  BSDFSample *pBVar12;
  BSDFSample *pBVar13;
  PhaseFunctionSample *pPVar14;
  uint uVar15;
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *pLVar16;
  pbrt *this_00;
  long in_FS_OFFSET;
  undefined1 auVar17 [16];
  float fVar18;
  Float FVar20;
  Float FVar19;
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined4 extraout_XMM0_Dc;
  ulong in_XMM0_Qb;
  undefined1 auVar61 [56];
  undefined1 auVar26 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar30 [64];
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar21 [16];
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 extraout_var_04 [56];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd_03;
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar23 [16];
  undefined1 extraout_var_05 [56];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 extraout_var_06 [56];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 extraout_var_07 [56];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 extraout_var_08 [56];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined4 in_XMM1_Db;
  uint in_XMM1_Dd;
  undefined1 auVar100 [56];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  float fVar101;
  ulong in_XMM2_Qb;
  float fVar102;
  Vector3f wo_00;
  Vector3<float> args;
  Vector3f wo_01;
  Vector3f wo_02;
  Vector3f wo_03;
  Vector3f wo_04;
  Vector3f wo_05;
  Vector3f wo_06;
  Vector3f wo_07;
  Vector3f wo_08;
  Vector3<float> VVar103;
  Vector3f wo_09;
  Vector3f wo_10;
  Vector3f wo_11;
  Vector3f wo_12;
  Vector3f wo_13;
  SampledSpectrum SVar104;
  Vector3f wi_00;
  Vector3f wi_01;
  Vector3f wi_02;
  Vector3f wi_03;
  Vector3f wi_04;
  Vector3f w;
  undefined1 local_258 [16];
  undefined1 local_238 [16];
  SampledSpectrum fExit;
  HGPhaseFunction phase;
  SampledSpectrum local_208;
  optional<pbrt::PhaseFunctionSample> ps;
  bool local_1cc;
  float local_1c8;
  undefined4 uStack_1c4;
  undefined8 uStack_1c0;
  SampledSpectrum beta;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> local_198;
  ulong local_188;
  ulong uStack_180;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  SampledSpectrum *local_158;
  SampledSpectrum local_150;
  SampledSpectrum local_140;
  float local_130;
  TransportMode local_12c;
  optional<pbrt::BSDFSample> wis;
  undefined1 local_f8 [16];
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> local_e8;
  SampledSpectrum local_d8;
  ulong local_c8;
  ulong uStack_c0;
  SampledSpectrum local_b8;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> local_a8;
  undefined1 local_98 [16];
  SampledSpectrum local_88;
  anon_class_8_1_ba1d750b r;
  optional<pbrt::BSDFSample> wos;
  RNG rng;
  undefined1 auVar25 [64];
  undefined1 auVar34 [64];
  undefined1 auVar44 [64];
  undefined1 auVar57 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 auVar69 [64];
  undefined1 auVar75 [64];
  undefined1 auVar84 [64];
  undefined1 auVar96 [64];
  
  fVar102 = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  local_188 = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_c8 = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_f8._4_4_ = in_XMM1_Db;
  local_f8._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  local_f8._8_4_ = 0;
  local_f8._12_4_ = in_XMM1_Dd;
  uStack_180 = in_XMM2_Qb;
  uStack_c0 = in_XMM0_Qb;
  SampledSpectrum::SampledSpectrum(&local_d8,0.0);
  if (((this->config).twoSided != '\0') && (wo.super_Tuple3<pbrt::Vector3,_float>.z < 0.0)) {
    local_f8._0_8_ = local_f8._0_8_ ^ 0x8000000080000000;
    local_f8._8_4_ = 0x80000000;
    local_f8._12_4_ = in_XMM1_Dd ^ 0x80000000;
    local_c8 = local_c8 ^ 0x8000000080000000;
    uStack_c0 = uStack_c0 ^ 0x8000000080000000;
    local_188 = local_188 ^ 0x8000000080000000;
    uStack_180 = uStack_180 ^ 0x8000000080000000;
    fVar102 = -fVar102;
  }
  pLVar16 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0;
  fVar101 = local_f8._0_4_;
  local_198.bottom = &this->bottom;
  local_e8.bottom = (ConductorBxDF *)0x0;
  local_a8.top = &((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0)->top;
  if (0.0 < fVar101) {
    local_a8.top = &this->top;
  }
  local_a8.bottom = local_198.bottom;
  if (0.0 < fVar101) {
    local_a8.bottom = (ConductorBxDF *)pLVar16;
  }
  bVar9 = 0.0 < fVar102 * fVar101 == 0.0 < fVar101;
  local_e8.top = &this->top;
  local_198.top = &pLVar16->top;
  if (bVar9) {
    local_e8.bottom = local_198.bottom;
    local_e8.top = &((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)0x0)->top;
    local_198.bottom = (ConductorBxDF *)0x0;
    local_198.top = &this->top;
  }
  local_98 = ZEXT416((uint)bVar9 * (int)this->thickness);
  if (0.0 < fVar102 * fVar101) {
    bVar1 = (this->config).nSamples;
    wo_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar101;
    wo_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_c8;
    wo_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_c8._4_4_;
    auVar100 = ZEXT856(local_f8._8_8_);
    auVar61 = ZEXT856(uStack_c0);
    wi_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar102;
    wi_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_188;
    wi_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_188._4_4_;
    SVar104 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f
                        (&local_a8,wo_00,wi_00,mode);
    auVar69._0_8_ = SVar104.values.values._8_8_;
    auVar69._8_56_ = auVar100;
    auVar25._0_8_ = SVar104.values.values._0_8_;
    auVar25._8_56_ = auVar61;
    wos.optionalValue._0_16_ = vmovlhps_avx(auVar25._0_16_,auVar69._0_16_);
    auVar61 = (undefined1  [56])0x0;
    SVar104 = SampledSpectrum::operator*((SampledSpectrum *)&wos,(float)bVar1);
    auVar70._0_8_ = SVar104.values.values._8_8_;
    auVar70._8_56_ = auVar100;
    auVar26._0_8_ = SVar104.values.values._0_8_;
    auVar26._8_56_ = auVar61;
    local_d8.values.values = (array<float,_4>)vmovlhps_avx(auVar26._0_16_,auVar70._0_16_);
  }
  this_00 = (pbrt *)(ulong)*Options;
  VVar103.super_Tuple3<pbrt::Vector3,_float>.z = fVar101;
  VVar103.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_c8;
  VVar103.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_c8._4_4_;
  sequenceIndex = Hash<int,pbrt::Vector3<float>>(*Options,VVar103);
  args.super_Tuple3<pbrt::Vector3,_float>.z = fVar102;
  args.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_188;
  args.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_188._4_4_;
  seed = Hash<pbrt::Vector3<float>>(this_00,args);
  RNG::SetSequence(&rng,sequenceIndex,seed);
  local_12c = (TransportMode)(mode == Radiance);
  local_158 = &this->albedo;
  uVar2 = vcmpss_avx512f(ZEXT816(0) << 0x40,local_f8,1);
  r.rng = &rng;
  do {
    bVar1 = (this->config).nSamples;
    if ((uint)bVar1 <= (uint)pLVar16) {
      SVar104 = SampledSpectrum::operator/(&local_d8,(float)bVar1);
      return (array<float,_4>)(array<float,_4>)SVar104;
    }
    fVar18 = f::anon_class_8_1_ba1d750b::operator()(&r);
    local_258._0_4_ = f::anon_class_8_1_ba1d750b::operator()(&r);
    local_258._4_4_ = extraout_XMM0_Db;
    local_258._8_4_ = extraout_XMM0_Dc;
    local_258._12_4_ = extraout_XMM0_Dd;
    auVar27._0_4_ = f::anon_class_8_1_ba1d750b::operator()(&r);
    auVar27._4_60_ = extraout_var;
    auVar17 = vinsertps_avx(local_258,auVar27._0_16_,0x10);
    wo_01.super_Tuple3<pbrt::Vector3,_float>.z = fVar101;
    wo_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_c8;
    wo_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_c8._4_4_;
    auVar61 = ZEXT856(local_f8._8_8_);
    TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Sample_f
              (&wos,&local_a8,wo_01,fVar18,(Point2f)auVar17._0_8_,mode,Transmission);
    if (wos.set == true) {
      pBVar12 = pstd::optional<pbrt::BSDFSample>::value(&wos);
      bVar9 = SampledSpectrum::operator_cast_to_bool(&pBVar12->f);
      if (bVar9) {
        pBVar12 = pstd::optional<pbrt::BSDFSample>::value(&wos);
        if ((pBVar12->pdf != 0.0) || (NAN(pBVar12->pdf))) {
          pBVar12 = pstd::optional<pbrt::BSDFSample>::value(&wos);
          fVar18 = (pBVar12->wi).super_Tuple3<pbrt::Vector3,_float>.z;
          if ((fVar18 != 0.0) || (NAN(fVar18))) {
            pBVar12 = pstd::optional<pbrt::BSDFSample>::value(&wos);
            pBVar13 = pstd::optional<pbrt::BSDFSample>::value(&wos);
            auVar17._8_4_ = 0x7fffffff;
            auVar17._0_8_ = 0x7fffffff7fffffff;
            auVar17._12_4_ = 0x7fffffff;
            auVar17 = vandps_avx512vl(ZEXT416((uint)(pBVar13->wi).super_Tuple3<pbrt::Vector3,_float>
                                                    .z),auVar17);
            auVar100 = ZEXT856(auVar17._8_8_);
            SVar104 = SampledSpectrum::operator*(&pBVar12->f,auVar17._0_4_);
            auVar71._0_8_ = SVar104.values.values._8_8_;
            auVar71._8_56_ = auVar61;
            auVar28._0_8_ = SVar104.values.values._0_8_;
            auVar28._8_56_ = auVar100;
            wis.optionalValue._0_16_ = vmovlhps_avx(auVar28._0_16_,auVar71._0_16_);
            pBVar12 = pstd::optional<pbrt::BSDFSample>::value(&wos);
            auVar100 = (undefined1  [56])0x0;
            SVar104 = SampledSpectrum::operator/((SampledSpectrum *)&wis,pBVar12->pdf);
            auVar72._0_8_ = SVar104.values.values._8_8_;
            auVar72._8_56_ = auVar61;
            auVar29._0_8_ = SVar104.values.values._0_8_;
            auVar29._8_56_ = auVar100;
            beta.values.values = (array<float,_4>)vmovlhps_avx(auVar29._0_16_,auVar72._0_16_);
            pBVar12 = pstd::optional<pbrt::BSDFSample>::value(&wos);
            w.super_Tuple3<pbrt::Vector3,_float>.z =
                 (pBVar12->wi).super_Tuple3<pbrt::Vector3,_float>.z;
            w.super_Tuple3<pbrt::Vector3,_float>.x =
                 (pBVar12->wi).super_Tuple3<pbrt::Vector3,_float>.x;
            w.super_Tuple3<pbrt::Vector3,_float>.y =
                 (pBVar12->wi).super_Tuple3<pbrt::Vector3,_float>.y;
            local_168 = ZEXT416((uint)((byte)uVar2 & 1) * (int)this->thickness);
            phase.g = this->g;
            fVar18 = f::anon_class_8_1_ba1d750b::operator()(&r);
            local_258._0_4_ = f::anon_class_8_1_ba1d750b::operator()(&r);
            local_258._4_4_ = extraout_XMM0_Db_00;
            local_258._8_4_ = extraout_XMM0_Dc_00;
            local_258._12_4_ = extraout_XMM0_Dd_00;
            auVar30._0_4_ = f::anon_class_8_1_ba1d750b::operator()(&r);
            auVar30._4_60_ = extraout_var_00;
            auVar17 = vinsertps_avx(local_258,auVar30._0_16_,0x10);
            wo_02.super_Tuple3<pbrt::Vector3,_float>.z = fVar102;
            wo_02.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_188;
            wo_02.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_188._4_4_;
            TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Sample_f
                      (&wis,&local_198,wo_02,fVar18,(Point2f)auVar17._0_8_,local_12c,Transmission);
            if (wis.set == true) {
              pBVar12 = pstd::optional<pbrt::BSDFSample>::value(&wis);
              bVar9 = SampledSpectrum::operator_cast_to_bool(&pBVar12->f);
              if (bVar9) {
                pBVar12 = pstd::optional<pbrt::BSDFSample>::value(&wis);
                if ((pBVar12->pdf != 0.0) || (NAN(pBVar12->pdf))) {
                  pBVar12 = pstd::optional<pbrt::BSDFSample>::value(&wis);
                  fVar18 = (pBVar12->wi).super_Tuple3<pbrt::Vector3,_float>.z;
                  if ((fVar18 != 0.0) || (NAN(fVar18))) {
                    for (uVar15 = 0; uVar15 < (this->config).maxDepth; uVar15 = uVar15 + 1) {
                      if ((3 < uVar15) &&
                         (FVar19 = SampledSpectrum::MaxComponentValue(&beta), FVar19 < 0.25)) {
                        FVar19 = SampledSpectrum::MaxComponentValue(&beta);
                        auVar17 = vmaxss_avx(ZEXT416((uint)(1.0 - FVar19)),ZEXT416(0));
                        fVar18 = f::anon_class_8_1_ba1d750b::operator()(&r);
                        if (fVar18 < auVar17._0_4_) break;
                        SampledSpectrum::operator/=(&beta,1.0 - auVar17._0_4_);
                      }
                      bVar9 = SampledSpectrum::operator_cast_to_bool(local_158);
                      if (!bVar9) {
                        auVar17 = ZEXT416((uint)this->thickness);
                        FVar19 = Tr(this->thickness,&w);
                        SampledSpectrum::operator*=(&beta,FVar19);
                        uVar3 = vcmpss_avx512f(auVar17,ZEXT416((uint)local_168._0_4_),0);
                        bVar1 = (byte)uVar3;
LAB_0038e783:
                        fVar18 = (float)((uint)!(bool)(bVar1 & 1) * auVar17._0_4_);
                        local_168._4_12_ = auVar17._4_12_;
                        local_168._0_4_ = fVar18;
                        if ((fVar18 != (float)local_98._0_4_) ||
                           (NAN(fVar18) || NAN((float)local_98._0_4_))) {
                          BVar10 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>
                                   ::Flags(&local_e8);
                          if ((BVar10 & Specular) == Unset) {
                            BVar10 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>
                                     ::Flags(&local_198);
                            FVar19 = 1.0;
                            if ((BVar10 & Specular) == Unset) {
                              pBVar12 = pstd::optional<pbrt::BSDFSample>::value(&wis);
                              fVar62 = w.super_Tuple3<pbrt::Vector3,_float>.z;
                              uVar3 = w.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                              fVar18 = pBVar12->pdf;
                              pBVar12 = pstd::optional<pbrt::BSDFSample>::value(&wis);
                              VVar103 = Tuple3<pbrt::Vector3,_float>::operator-
                                                  (&(pBVar12->wi).super_Tuple3<pbrt::Vector3,_float>
                                                  );
                              wo_04.super_Tuple3<pbrt::Vector3,_float>.z = -fVar62;
                              wo_04.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                                   uVar3 ^ 0x8000000080000000;
                              FVar19 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>
                                       ::PDF(&local_e8,wo_04,
                                             (Vector3f)VVar103.super_Tuple3<pbrt::Vector3,_float>,
                                             mode,All);
                              fVar18 = fVar18 * fVar18;
                              FVar19 = fVar18 / (fVar18 + FVar19 * FVar19);
                            }
                            fVar18 = w.super_Tuple3<pbrt::Vector3,_float>.z;
                            uVar3 = w.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                            pBVar12 = pstd::optional<pbrt::BSDFSample>::value(&wis);
                            VVar103 = Tuple3<pbrt::Vector3,_float>::operator-
                                                (&(pBVar12->wi).super_Tuple3<pbrt::Vector3,_float>);
                            wo_05.super_Tuple3<pbrt::Vector3,_float>.z = -fVar18;
                            auVar63._8_4_ = 0x80000000;
                            auVar63._0_8_ = 0x8000000080000000;
                            auVar63._12_4_ = 0x80000000;
                            auVar22._0_8_ = uVar3 ^ 0x8000000080000000;
                            auVar22._8_4_ = 0x80000000;
                            auVar22._12_4_ = 0x80000000;
                            wo_05.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar22._0_8_;
                            wo_05.super_Tuple3<pbrt::Vector3,_float>.y =
                                 (float)(int)(auVar22._0_8_ >> 0x20);
                            auVar100 = ZEXT856(auVar63._8_8_);
                            auVar61 = ZEXT856(auVar22._8_8_);
                            SVar104 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>
                                      ::f(&local_e8,wo_05,
                                          (Vector3f)VVar103.super_Tuple3<pbrt::Vector3,_float>,mode)
                            ;
                            auVar75._0_8_ = SVar104.values.values._8_8_;
                            auVar75._8_56_ = auVar100;
                            auVar34._0_8_ = SVar104.values.values._0_8_;
                            auVar34._8_56_ = auVar61;
                            local_88.values.values =
                                 (array<float,_4>)vmovlhps_avx(auVar34._0_16_,auVar75._0_16_);
                            auVar61 = ZEXT856(local_88.values.values._8_8_);
                            SVar104 = SampledSpectrum::operator*(&beta,&local_88);
                            auVar76._0_8_ = SVar104.values.values._8_8_;
                            auVar76._8_56_ = auVar100;
                            auVar35._0_8_ = SVar104.values.values._0_8_;
                            auVar35._8_56_ = auVar61;
                            local_b8.values.values =
                                 (array<float,_4>)vmovlhps_avx(auVar35._0_16_,auVar76._0_16_);
                            pBVar12 = pstd::optional<pbrt::BSDFSample>::value(&wis);
                            auVar7._8_4_ = 0x7fffffff;
                            auVar7._0_8_ = 0x7fffffff7fffffff;
                            auVar7._12_4_ = 0x7fffffff;
                            auVar17 = vandps_avx512vl(ZEXT416((uint)(pBVar12->wi).
                                                                                                                                        
                                                  super_Tuple3<pbrt::Vector3,_float>.z),auVar7);
                            auVar61 = ZEXT856(auVar17._8_8_);
                            SVar104 = SampledSpectrum::operator*(&local_b8,auVar17._0_4_);
                            auVar77._0_8_ = SVar104.values.values._8_8_;
                            auVar77._8_56_ = auVar100;
                            auVar36._0_8_ = SVar104.values.values._0_8_;
                            auVar36._8_56_ = auVar61;
                            local_150.values.values =
                                 (array<float,_4>)vmovlhps_avx(auVar36._0_16_,auVar77._0_16_);
                            auVar61 = (undefined1  [56])0x0;
                            SVar104 = SampledSpectrum::operator*(&local_150,FVar19);
                            auVar78._0_8_ = SVar104.values.values._8_8_;
                            auVar78._8_56_ = auVar100;
                            auVar37._0_8_ = SVar104.values.values._0_8_;
                            auVar37._8_56_ = auVar61;
                            local_140.values.values =
                                 (array<float,_4>)vmovlhps_avx(auVar37._0_16_,auVar78._0_16_);
                            FVar19 = this->thickness;
                            pBVar12 = pstd::optional<pbrt::BSDFSample>::value(&wis);
                            FVar19 = Tr(FVar19,&pBVar12->wi);
                            auVar61 = extraout_var_04;
                            SVar104 = SampledSpectrum::operator*(&local_140,FVar19);
                            auVar79._0_8_ = SVar104.values.values._8_8_;
                            auVar79._8_56_ = auVar100;
                            auVar38._0_8_ = SVar104.values.values._0_8_;
                            auVar38._8_56_ = auVar61;
                            local_208.values.values =
                                 (array<float,_4>)vmovlhps_avx(auVar38._0_16_,auVar79._0_16_);
                            auVar61 = ZEXT856(local_208.values.values._8_8_);
                            pBVar12 = pstd::optional<pbrt::BSDFSample>::value(&wis);
                            SVar104 = SampledSpectrum::operator*(&local_208,&pBVar12->f);
                            auVar80._0_8_ = SVar104.values.values._8_8_;
                            auVar80._8_56_ = auVar100;
                            auVar39._0_8_ = SVar104.values.values._0_8_;
                            auVar39._8_56_ = auVar61;
                            fExit.values.values =
                                 (array<float,_4>)vmovlhps_avx(auVar39._0_16_,auVar80._0_16_);
                            pBVar12 = pstd::optional<pbrt::BSDFSample>::value(&wis);
                            auVar61 = (undefined1  [56])0x0;
                            SVar104 = SampledSpectrum::operator/(&fExit,pBVar12->pdf);
                            auVar81._0_8_ = SVar104.values.values._8_8_;
                            auVar81._8_56_ = auVar100;
                            auVar40._0_8_ = SVar104.values.values._0_8_;
                            auVar40._8_56_ = auVar61;
                            ps.optionalValue._0_16_ = vmovlhps_avx(auVar40._0_16_,auVar81._0_16_);
                            SampledSpectrum::operator+=(&local_d8,(SampledSpectrum *)&ps);
                          }
                          fVar18 = f::anon_class_8_1_ba1d750b::operator()(&r);
                          local_238._0_4_ = f::anon_class_8_1_ba1d750b::operator()(&r);
                          local_238._4_4_ = extraout_XMM0_Db_03;
                          local_238._8_4_ = extraout_XMM0_Dc_03;
                          local_238._12_4_ = extraout_XMM0_Dd_03;
                          auVar41._0_4_ = f::anon_class_8_1_ba1d750b::operator()(&r);
                          auVar41._4_60_ = extraout_var_02;
                          auVar64._0_4_ = -w.super_Tuple3<pbrt::Vector3,_float>.z;
                          auVar64._4_4_ = 0x80000000;
                          auVar64._8_4_ = 0x80000000;
                          auVar64._12_4_ = 0x80000000;
                          auVar17 = vinsertps_avx(local_238,auVar41._0_16_,0x10);
                          wo_06.super_Tuple3<pbrt::Vector3,_float>.z = auVar64._0_4_;
                          wo_06.super_Tuple3<pbrt::Vector3,_float>.x =
                               (float)(int)(w.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^
                                           0x8000000080000000);
                          wo_06.super_Tuple3<pbrt::Vector3,_float>.y =
                               (float)(int)((w.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^
                                            0x8000000080000000) >> 0x20);
                          auVar61 = ZEXT856(auVar64._8_8_);
                          TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::
                          Sample_f((optional<pbrt::BSDFSample> *)&ps,&local_e8,wo_06,fVar18,
                                   (Point2f)auVar17._0_8_,mode,Reflection);
                          if (local_1cc == true) {
                            pBVar12 = pstd::optional<pbrt::BSDFSample>::value
                                                ((optional<pbrt::BSDFSample> *)&ps);
                            bVar9 = SampledSpectrum::operator_cast_to_bool(&pBVar12->f);
                            if (bVar9) {
                              pBVar12 = pstd::optional<pbrt::BSDFSample>::value
                                                  ((optional<pbrt::BSDFSample> *)&ps);
                              if ((pBVar12->pdf != 0.0) || (NAN(pBVar12->pdf))) {
                                pBVar12 = pstd::optional<pbrt::BSDFSample>::value
                                                    ((optional<pbrt::BSDFSample> *)&ps);
                                fVar18 = (pBVar12->wi).super_Tuple3<pbrt::Vector3,_float>.z;
                                if ((fVar18 != 0.0) || (NAN(fVar18))) {
                                  pBVar12 = pstd::optional<pbrt::BSDFSample>::value
                                                      ((optional<pbrt::BSDFSample> *)&ps);
                                  pBVar13 = pstd::optional<pbrt::BSDFSample>::value
                                                      ((optional<pbrt::BSDFSample> *)&ps);
                                  auVar8._8_4_ = 0x7fffffff;
                                  auVar8._0_8_ = 0x7fffffff7fffffff;
                                  auVar8._12_4_ = 0x7fffffff;
                                  auVar17 = vandps_avx512vl(ZEXT416((uint)(pBVar13->wi).
                                                                                                                                                    
                                                  super_Tuple3<pbrt::Vector3,_float>.z),auVar8);
                                  auVar100 = ZEXT856(auVar17._8_8_);
                                  SVar104 = SampledSpectrum::operator*(&pBVar12->f,auVar17._0_4_);
                                  auVar82._0_8_ = SVar104.values.values._8_8_;
                                  auVar82._8_56_ = auVar61;
                                  auVar42._0_8_ = SVar104.values.values._0_8_;
                                  auVar42._8_56_ = auVar100;
                                  local_208.values.values =
                                       (array<float,_4>)vmovlhps_avx(auVar42._0_16_,auVar82._0_16_);
                                  pBVar12 = pstd::optional<pbrt::BSDFSample>::value
                                                      ((optional<pbrt::BSDFSample> *)&ps);
                                  auVar100 = (undefined1  [56])0x0;
                                  SVar104 = SampledSpectrum::operator/(&local_208,pBVar12->pdf);
                                  auVar83._0_8_ = SVar104.values.values._8_8_;
                                  auVar83._8_56_ = auVar61;
                                  auVar43._0_8_ = SVar104.values.values._0_8_;
                                  auVar43._8_56_ = auVar100;
                                  fExit.values.values =
                                       (array<float,_4>)vmovlhps_avx(auVar43._0_16_,auVar83._0_16_);
                                  SampledSpectrum::operator*=(&beta,&fExit);
                                  pBVar12 = pstd::optional<pbrt::BSDFSample>::value
                                                      ((optional<pbrt::BSDFSample> *)&ps);
                                  w.super_Tuple3<pbrt::Vector3,_float>.z =
                                       (pBVar12->wi).super_Tuple3<pbrt::Vector3,_float>.z;
                                  w.super_Tuple3<pbrt::Vector3,_float>.x =
                                       (pBVar12->wi).super_Tuple3<pbrt::Vector3,_float>.x;
                                  w.super_Tuple3<pbrt::Vector3,_float>.y =
                                       (pBVar12->wi).super_Tuple3<pbrt::Vector3,_float>.y;
                                  BVar10 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>
                                           ::Flags(&local_198);
                                  if ((BVar10 & Specular) == Unset) {
                                    auVar65._0_4_ = -w.super_Tuple3<pbrt::Vector3,_float>.z;
                                    auVar65._4_4_ = 0x80000000;
                                    auVar65._8_4_ = 0x80000000;
                                    auVar65._12_4_ = 0x80000000;
                                    auVar23._0_8_ =
                                         w.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^
                                         0x8000000080000000;
                                    auVar23._8_4_ = 0x80000000;
                                    auVar23._12_4_ = 0x80000000;
                                    wo_07.super_Tuple3<pbrt::Vector3,_float>.z = auVar65._0_4_;
                                    wo_07.super_Tuple3<pbrt::Vector3,_float>.x =
                                         (float)(int)auVar23._0_8_;
                                    wo_07.super_Tuple3<pbrt::Vector3,_float>.y =
                                         (float)(int)(auVar23._0_8_ >> 0x20);
                                    auVar100 = ZEXT856(auVar65._8_8_);
                                    auVar61 = ZEXT856(auVar23._8_8_);
                                    wi_01.super_Tuple3<pbrt::Vector3,_float>.z = fVar102;
                                    wi_01.super_Tuple3<pbrt::Vector3,_float>.x =
                                         (float)(undefined4)local_188;
                                    wi_01.super_Tuple3<pbrt::Vector3,_float>.y =
                                         (float)local_188._4_4_;
                                    SVar104 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>
                                              ::f(&local_198,wo_07,wi_01,mode);
                                    auVar84._0_8_ = SVar104.values.values._8_8_;
                                    auVar84._8_56_ = auVar100;
                                    auVar44._0_8_ = SVar104.values.values._0_8_;
                                    auVar44._8_56_ = auVar61;
                                    fExit.values.values =
                                         (array<float,_4>)
                                         vmovlhps_avx(auVar44._0_16_,auVar84._0_16_);
                                    bVar9 = SampledSpectrum::operator_cast_to_bool(&fExit);
                                    if (bVar9) {
                                      BVar10 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>
                                               ::Flags(&local_e8);
                                      FVar19 = 1.0;
                                      if ((BVar10 & Specular) == Unset) {
                                        wo_08.super_Tuple3<pbrt::Vector3,_float>.z =
                                             -w.super_Tuple3<pbrt::Vector3,_float>.z;
                                        wo_08.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                                             w.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^
                                             0x8000000080000000;
                                        wi_02.super_Tuple3<pbrt::Vector3,_float>.z = fVar102;
                                        wi_02.super_Tuple3<pbrt::Vector3,_float>.x =
                                             (float)(undefined4)local_188;
                                        wi_02.super_Tuple3<pbrt::Vector3,_float>.y =
                                             (float)local_188._4_4_;
                                        FVar19 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>
                                                 ::PDF(&local_198,wo_08,wi_02,mode,Transmission);
                                        pBVar12 = pstd::optional<pbrt::BSDFSample>::value
                                                            ((optional<pbrt::BSDFSample> *)&ps);
                                        fVar18 = pBVar12->pdf * pBVar12->pdf;
                                        FVar19 = fVar18 / (FVar19 * FVar19 + fVar18);
                                      }
                                      FVar20 = this->thickness;
                                      auVar100 = (undefined1  [56])0x0;
                                      pBVar12 = pstd::optional<pbrt::BSDFSample>::value
                                                          ((optional<pbrt::BSDFSample> *)&ps);
                                      FVar20 = Tr(FVar20,&pBVar12->wi);
                                      auVar61 = extraout_var_05;
                                      SVar104 = SampledSpectrum::operator*(&beta,FVar20);
                                      auVar85._0_8_ = SVar104.values.values._8_8_;
                                      auVar85._8_56_ = auVar100;
                                      auVar45._0_8_ = SVar104.values.values._0_8_;
                                      auVar45._8_56_ = auVar61;
                                      local_150.values.values =
                                           (array<float,_4>)
                                           vmovlhps_avx(auVar45._0_16_,auVar85._0_16_);
                                      auVar61 = ZEXT856(local_150.values.values._8_8_);
                                      SVar104 = SampledSpectrum::operator*(&local_150,&fExit);
                                      auVar86._0_8_ = SVar104.values.values._8_8_;
                                      auVar86._8_56_ = auVar100;
                                      auVar46._0_8_ = SVar104.values.values._0_8_;
                                      auVar46._8_56_ = auVar61;
                                      local_140.values.values =
                                           (array<float,_4>)
                                           vmovlhps_avx(auVar46._0_16_,auVar86._0_16_);
                                      auVar61 = (undefined1  [56])0x0;
                                      SVar104 = SampledSpectrum::operator*(&local_140,FVar19);
                                      auVar87._0_8_ = SVar104.values.values._8_8_;
                                      auVar87._8_56_ = auVar100;
                                      auVar47._0_8_ = SVar104.values.values._0_8_;
                                      auVar47._8_56_ = auVar61;
                                      local_208.values.values =
                                           (array<float,_4>)
                                           vmovlhps_avx(auVar47._0_16_,auVar87._0_16_);
                                      SampledSpectrum::operator+=(&local_d8,&local_208);
                                    }
                                  }
                                  goto LAB_0038ee56;
                                }
                              }
                            }
                          }
                        }
                        else {
                          fVar18 = f::anon_class_8_1_ba1d750b::operator()(&r);
                          local_238._0_8_ =
                               w.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                          local_1c8 = -w.super_Tuple3<pbrt::Vector3,_float>.z;
                          uStack_1c4 = 0x80000000;
                          uStack_1c0._0_4_ = 0x80000000;
                          uStack_1c0._4_4_ = 0x80000000;
                          local_178._0_4_ = f::anon_class_8_1_ba1d750b::operator()(&r);
                          local_178._4_4_ = extraout_XMM0_Db_02;
                          local_178._8_4_ = extraout_XMM0_Dc_02;
                          local_178._12_4_ = extraout_XMM0_Dd_02;
                          auVar31._0_4_ = f::anon_class_8_1_ba1d750b::operator()(&r);
                          auVar31._4_60_ = extraout_var_01;
                          auVar17 = vinsertps_avx(local_178,auVar31._0_16_,0x10);
                          wo_03.super_Tuple3<pbrt::Vector3,_float>.z = local_1c8;
                          wo_03.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_238._0_4_;
                          wo_03.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_238._4_4_;
                          auVar61 = ZEXT856(uStack_1c0);
                          TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::
                          Sample_f((optional<pbrt::BSDFSample> *)&ps,&local_198,wo_03,fVar18,
                                   (Point2f)auVar17._0_8_,mode,Reflection);
                          if (local_1cc == true) {
                            pBVar12 = pstd::optional<pbrt::BSDFSample>::value
                                                ((optional<pbrt::BSDFSample> *)&ps);
                            bVar9 = SampledSpectrum::operator_cast_to_bool(&pBVar12->f);
                            if (bVar9) {
                              pBVar12 = pstd::optional<pbrt::BSDFSample>::value
                                                  ((optional<pbrt::BSDFSample> *)&ps);
                              if ((pBVar12->pdf != 0.0) || (NAN(pBVar12->pdf))) {
                                pBVar12 = pstd::optional<pbrt::BSDFSample>::value
                                                    ((optional<pbrt::BSDFSample> *)&ps);
                                fVar18 = (pBVar12->wi).super_Tuple3<pbrt::Vector3,_float>.z;
                                if ((fVar18 != 0.0) || (NAN(fVar18))) {
                                  pBVar12 = pstd::optional<pbrt::BSDFSample>::value
                                                      ((optional<pbrt::BSDFSample> *)&ps);
                                  pBVar13 = pstd::optional<pbrt::BSDFSample>::value
                                                      ((optional<pbrt::BSDFSample> *)&ps);
                                  auVar6._8_4_ = 0x7fffffff;
                                  auVar6._0_8_ = 0x7fffffff7fffffff;
                                  auVar6._12_4_ = 0x7fffffff;
                                  auVar17 = vandps_avx512vl(ZEXT416((uint)(pBVar13->wi).
                                                                                                                                                    
                                                  super_Tuple3<pbrt::Vector3,_float>.z),auVar6);
                                  auVar100 = ZEXT856(auVar17._8_8_);
                                  SVar104 = SampledSpectrum::operator*(&pBVar12->f,auVar17._0_4_);
                                  auVar73._0_8_ = SVar104.values.values._8_8_;
                                  auVar73._8_56_ = auVar61;
                                  auVar32._0_8_ = SVar104.values.values._0_8_;
                                  auVar32._8_56_ = auVar100;
                                  local_208.values.values =
                                       (array<float,_4>)vmovlhps_avx(auVar32._0_16_,auVar73._0_16_);
                                  pBVar12 = pstd::optional<pbrt::BSDFSample>::value
                                                      ((optional<pbrt::BSDFSample> *)&ps);
                                  auVar100 = (undefined1  [56])0x0;
                                  SVar104 = SampledSpectrum::operator/(&local_208,pBVar12->pdf);
                                  auVar74._0_8_ = SVar104.values.values._8_8_;
                                  auVar74._8_56_ = auVar61;
                                  auVar33._0_8_ = SVar104.values.values._0_8_;
                                  auVar33._8_56_ = auVar100;
                                  fExit.values.values =
                                       (array<float,_4>)vmovlhps_avx(auVar33._0_16_,auVar74._0_16_);
                                  SampledSpectrum::operator*=(&beta,&fExit);
                                  pBVar12 = pstd::optional<pbrt::BSDFSample>::value
                                                      ((optional<pbrt::BSDFSample> *)&ps);
                                  w.super_Tuple3<pbrt::Vector3,_float>.z =
                                       (pBVar12->wi).super_Tuple3<pbrt::Vector3,_float>.z;
                                  w.super_Tuple3<pbrt::Vector3,_float>.x =
                                       (pBVar12->wi).super_Tuple3<pbrt::Vector3,_float>.x;
                                  w.super_Tuple3<pbrt::Vector3,_float>.y =
                                       (pBVar12->wi).super_Tuple3<pbrt::Vector3,_float>.y;
LAB_0038ee56:
                                  pstd::optional<pbrt::BSDFSample>::~optional
                                            ((optional<pbrt::BSDFSample> *)&ps);
                                  goto LAB_0038ee60;
                                }
                              }
                            }
                          }
                        }
                        pstd::optional<pbrt::BSDFSample>::~optional
                                  ((optional<pbrt::BSDFSample> *)&ps);
                        break;
                      }
                      fVar18 = f::anon_class_8_1_ba1d750b::operator()(&r);
                      auVar4._8_4_ = 0x7fffffff;
                      auVar4._0_8_ = 0x7fffffff7fffffff;
                      auVar4._12_4_ = 0x7fffffff;
                      auVar17 = vandps_avx512vl(ZEXT416((uint)w.super_Tuple3<pbrt::Vector3,_float>.z
                                                       ),auVar4);
                      local_258._0_4_ = SampleExponential(fVar18,1.0 / auVar17._0_4_);
                      local_258._4_4_ = extraout_XMM0_Db_01;
                      local_258._8_4_ = extraout_XMM0_Dc_01;
                      local_258._12_4_ = extraout_XMM0_Dd_01;
                      auVar21._0_12_ = ZEXT412(0);
                      auVar21._12_4_ = 0;
                      uVar3 = vcmpss_avx512f(auVar21,ZEXT416((uint)w.
                                                  super_Tuple3<pbrt::Vector3,_float>.z),1);
                      bVar9 = (bool)((byte)uVar3 & 1);
                      if ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>::
                           f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::reg ==
                           '\0') &&
                         (iVar11 = __cxa_guard_acquire(&
                                                  LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>
                                                  ::
                                                  f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)
                                                  ::reg), iVar11 != 0)) {
                        StatRegisterer::StatRegisterer
                                  ((StatRegisterer *)
                                   &LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>::
                                    f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)
                                    ::reg,const::{lambda(pbrt::StatsAccumulator&)#1}::
                                          StatsAccumulator__,(PixelAccumFunc)0x0);
                        __cxa_guard_release(&LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>
                                             ::
                                             f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)
                                             ::reg);
                      }
                      *(long *)(in_FS_OFFSET + -0x128) = *(long *)(in_FS_OFFSET + -0x128) + 1;
                      auVar5._8_4_ = 0x80000000;
                      auVar5._0_8_ = 0x8000000080000000;
                      auVar5._12_4_ = 0x80000000;
                      auVar17 = vxorps_avx512vl(local_258,auVar5);
                      auVar61 = ZEXT856((ulong)local_168._8_8_);
                      fVar62 = local_168._0_4_;
                      fVar18 = fVar62 + (float)((uint)bVar9 * local_258._0_4_ +
                                               (uint)!bVar9 * auVar17._0_4_);
                      if ((fVar62 != fVar18) || (NAN(fVar62) || NAN(fVar18))) {
                        if ((fVar18 <= 0.0) || (this->thickness <= fVar18)) {
                          auVar17 = vminss_avx(ZEXT416((uint)this->thickness),ZEXT416((uint)fVar18))
                          ;
                          uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar18),ZEXT816(0),1);
                          bVar1 = (byte)uVar3;
                          goto LAB_0038e783;
                        }
                        BVar10 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>
                                 ::Flags(&local_198);
                        auVar100 = (undefined1  [56])0x0;
                        FVar19 = 1.0;
                        if ((BVar10 & Specular) == Unset) {
                          pBVar12 = pstd::optional<pbrt::BSDFSample>::value(&wis);
                          fVar62 = w.super_Tuple3<pbrt::Vector3,_float>.z;
                          uVar3 = w.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                          local_178._0_4_ = pBVar12->pdf;
                          pBVar12 = pstd::optional<pbrt::BSDFSample>::value(&wis);
                          VVar103 = Tuple3<pbrt::Vector3,_float>::operator-
                                              (&(pBVar12->wi).super_Tuple3<pbrt::Vector3,_float>);
                          wo_09.super_Tuple3<pbrt::Vector3,_float>.z = -fVar62;
                          wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                               uVar3 ^ 0x8000000080000000;
                          FVar19 = HGPhaseFunction::p(&phase,wo_09,
                                                      (Vector3f)
                                                      VVar103.super_Tuple3<pbrt::Vector3,_float>);
                          auVar61 = (undefined1  [56])0x0;
                          FVar19 = ((float)local_178._0_4_ * (float)local_178._0_4_) /
                                   ((float)local_178._0_4_ * (float)local_178._0_4_ +
                                   FVar19 * FVar19);
                          auVar100 = ZEXT856(0);
                        }
                        SVar104 = SampledSpectrum::operator*(&beta,local_158);
                        uVar3 = w.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                        auVar88._0_8_ = SVar104.values.values._8_8_;
                        auVar88._8_56_ = auVar61;
                        auVar48._0_8_ = SVar104.values.values._0_8_;
                        auVar48._8_56_ = auVar100;
                        local_b8.values.values =
                             (array<float,_4>)vmovlhps_avx(auVar48._0_16_,auVar88._0_16_);
                        local_178 = ZEXT416((uint)w.super_Tuple3<pbrt::Vector3,_float>.z);
                        pBVar12 = pstd::optional<pbrt::BSDFSample>::value(&wis);
                        VVar103 = Tuple3<pbrt::Vector3,_float>::operator-
                                            (&(pBVar12->wi).super_Tuple3<pbrt::Vector3,_float>);
                        wo_10.super_Tuple3<pbrt::Vector3,_float>.z = -local_178._0_4_;
                        auVar66._0_8_ = local_178._0_8_ ^ 0x8000000080000000;
                        auVar66._8_4_ = local_178._8_4_ ^ 0x80000000;
                        auVar66._12_4_ = local_178._12_4_ ^ 0x80000000;
                        wo_10.super_Tuple3<pbrt::Vector3,_float>._0_8_ = uVar3 ^ 0x8000000080000000;
                        auVar100 = ZEXT856(auVar66._8_8_);
                        FVar20 = HGPhaseFunction::p(&phase,wo_10,
                                                    (Vector3f)
                                                    VVar103.super_Tuple3<pbrt::Vector3,_float>);
                        auVar61 = extraout_var_06;
                        SVar104 = SampledSpectrum::operator*(&local_b8,FVar20);
                        auVar89._0_8_ = SVar104.values.values._8_8_;
                        auVar89._8_56_ = auVar100;
                        auVar49._0_8_ = SVar104.values.values._0_8_;
                        auVar49._8_56_ = auVar61;
                        local_150.values.values =
                             (array<float,_4>)vmovlhps_avx(auVar49._0_16_,auVar89._0_16_);
                        auVar61 = (undefined1  [56])0x0;
                        SVar104 = SampledSpectrum::operator*(&local_150,FVar19);
                        auVar90._0_8_ = SVar104.values.values._8_8_;
                        auVar90._8_56_ = auVar100;
                        auVar50._0_8_ = SVar104.values.values._0_8_;
                        auVar50._8_56_ = auVar61;
                        local_140.values.values =
                             (array<float,_4>)vmovlhps_avx(auVar50._0_16_,auVar90._0_16_);
                        pBVar12 = pstd::optional<pbrt::BSDFSample>::value(&wis);
                        local_130 = fVar18 - (float)local_98._0_4_;
                        FVar19 = Tr(local_130,&pBVar12->wi);
                        auVar61 = extraout_var_07;
                        SVar104 = SampledSpectrum::operator*(&local_140,FVar19);
                        auVar91._0_8_ = SVar104.values.values._8_8_;
                        auVar91._8_56_ = auVar100;
                        auVar51._0_8_ = SVar104.values.values._0_8_;
                        auVar51._8_56_ = auVar61;
                        local_208.values.values =
                             (array<float,_4>)vmovlhps_avx(auVar51._0_16_,auVar91._0_16_);
                        auVar61 = ZEXT856(local_208.values.values._8_8_);
                        pBVar12 = pstd::optional<pbrt::BSDFSample>::value(&wis);
                        SVar104 = SampledSpectrum::operator*(&local_208,&pBVar12->f);
                        auVar92._0_8_ = SVar104.values.values._8_8_;
                        auVar92._8_56_ = auVar100;
                        auVar52._0_8_ = SVar104.values.values._0_8_;
                        auVar52._8_56_ = auVar61;
                        fExit.values.values =
                             (array<float,_4>)vmovlhps_avx(auVar52._0_16_,auVar92._0_16_);
                        pBVar12 = pstd::optional<pbrt::BSDFSample>::value(&wis);
                        auVar61 = (undefined1  [56])0x0;
                        SVar104 = SampledSpectrum::operator/(&fExit,pBVar12->pdf);
                        auVar93._0_8_ = SVar104.values.values._8_8_;
                        auVar93._8_56_ = auVar100;
                        auVar53._0_8_ = SVar104.values.values._0_8_;
                        auVar53._8_56_ = auVar61;
                        ps.optionalValue._0_16_ = vmovlhps_avx(auVar53._0_16_,auVar93._0_16_);
                        SampledSpectrum::operator+=(&local_d8,(SampledSpectrum *)&ps);
                        local_258._0_8_ =
                             w.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                        local_1c8 = -w.super_Tuple3<pbrt::Vector3,_float>.z;
                        uStack_1c4 = 0x80000000;
                        uStack_1c0._0_4_ = 0x80000000;
                        uStack_1c0._4_4_ = 0x80000000;
                        local_178._0_4_ = f::anon_class_8_1_ba1d750b::operator()(&r);
                        local_178._4_4_ = extraout_XMM0_Db_04;
                        local_178._8_4_ = extraout_XMM0_Dc_04;
                        local_178._12_4_ = extraout_XMM0_Dd_04;
                        auVar54._0_4_ = f::anon_class_8_1_ba1d750b::operator()(&r);
                        auVar54._4_60_ = extraout_var_03;
                        auVar17 = vinsertps_avx(local_178,auVar54._0_16_,0x10);
                        wo_11.super_Tuple3<pbrt::Vector3,_float>.z = local_1c8;
                        wo_11.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_258._0_4_;
                        wo_11.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_258._4_4_;
                        auVar61 = ZEXT856(uStack_1c0);
                        HGPhaseFunction::Sample_p(&ps,&phase,wo_11,(Point2f)auVar17._0_8_);
                        if (ps.set == true) {
                          pPVar14 = pstd::optional<pbrt::PhaseFunctionSample>::value(&ps);
                          if ((pPVar14->pdf != 0.0) || (NAN(pPVar14->pdf))) {
                            pPVar14 = pstd::optional<pbrt::PhaseFunctionSample>::value(&ps);
                            fVar62 = (pPVar14->wi).super_Tuple3<pbrt::Vector3,_float>.z;
                            if ((fVar62 != 0.0) || (NAN(fVar62))) {
                              pPVar14 = pstd::optional<pbrt::PhaseFunctionSample>::value(&ps);
                              auVar100 = (undefined1  [56])0x0;
                              SVar104 = SampledSpectrum::operator*(local_158,pPVar14->p);
                              auVar94._0_8_ = SVar104.values.values._8_8_;
                              auVar94._8_56_ = auVar61;
                              auVar55._0_8_ = SVar104.values.values._0_8_;
                              auVar55._8_56_ = auVar100;
                              local_208.values.values =
                                   (array<float,_4>)vmovlhps_avx(auVar55._0_16_,auVar94._0_16_);
                              pPVar14 = pstd::optional<pbrt::PhaseFunctionSample>::value(&ps);
                              auVar100 = (undefined1  [56])0x0;
                              SVar104 = SampledSpectrum::operator/(&local_208,pPVar14->pdf);
                              auVar95._0_8_ = SVar104.values.values._8_8_;
                              auVar95._8_56_ = auVar61;
                              auVar56._0_8_ = SVar104.values.values._0_8_;
                              auVar56._8_56_ = auVar100;
                              fExit.values.values =
                                   (array<float,_4>)vmovlhps_avx(auVar56._0_16_,auVar95._0_16_);
                              SampledSpectrum::operator*=(&beta,&fExit);
                              pPVar14 = pstd::optional<pbrt::PhaseFunctionSample>::value(&ps);
                              w.super_Tuple3<pbrt::Vector3,_float>.z =
                                   (pPVar14->wi).super_Tuple3<pbrt::Vector3,_float>.z;
                              w.super_Tuple3<pbrt::Vector3,_float>.x =
                                   (pPVar14->wi).super_Tuple3<pbrt::Vector3,_float>.x;
                              w.super_Tuple3<pbrt::Vector3,_float>.y =
                                   (pPVar14->wi).super_Tuple3<pbrt::Vector3,_float>.y;
                              BVar10 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>
                                       ::Flags(&local_198);
                              if ((BVar10 & Specular) == Unset) {
                                auVar67._0_4_ = -w.super_Tuple3<pbrt::Vector3,_float>.z;
                                auVar67._4_4_ = 0x80000000;
                                auVar67._8_4_ = 0x80000000;
                                auVar67._12_4_ = 0x80000000;
                                auVar24._0_8_ =
                                     w.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000
                                ;
                                auVar24._8_4_ = 0x80000000;
                                auVar24._12_4_ = 0x80000000;
                                wo_12.super_Tuple3<pbrt::Vector3,_float>.z = auVar67._0_4_;
                                wo_12.super_Tuple3<pbrt::Vector3,_float>.x =
                                     (float)(int)auVar24._0_8_;
                                wo_12.super_Tuple3<pbrt::Vector3,_float>.y =
                                     (float)(int)(auVar24._0_8_ >> 0x20);
                                auVar100 = ZEXT856(auVar67._8_8_);
                                auVar61 = ZEXT856(auVar24._8_8_);
                                wi_03.super_Tuple3<pbrt::Vector3,_float>.z = fVar102;
                                wi_03.super_Tuple3<pbrt::Vector3,_float>.x =
                                     (float)(undefined4)local_188;
                                wi_03.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_188._4_4_;
                                SVar104 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>
                                          ::f(&local_198,wo_12,wi_03,mode);
                                auVar96._0_8_ = SVar104.values.values._8_8_;
                                auVar96._8_56_ = auVar100;
                                auVar57._0_8_ = SVar104.values.values._0_8_;
                                auVar57._8_56_ = auVar61;
                                fExit.values.values =
                                     (array<float,_4>)vmovlhps_avx(auVar57._0_16_,auVar96._0_16_);
                                bVar9 = SampledSpectrum::operator_cast_to_bool(&fExit);
                                if (bVar9) {
                                  auVar68._0_4_ = -w.super_Tuple3<pbrt::Vector3,_float>.z;
                                  auVar68._4_4_ = 0x80000000;
                                  auVar68._8_4_ = 0x80000000;
                                  auVar68._12_4_ = 0x80000000;
                                  wo_13.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                                       w.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^
                                       0x8000000080000000;
                                  wo_13.super_Tuple3<pbrt::Vector3,_float>.z = auVar68._0_4_;
                                  auVar100 = ZEXT856(auVar68._8_8_);
                                  wi_04.super_Tuple3<pbrt::Vector3,_float>.z = fVar102;
                                  wi_04.super_Tuple3<pbrt::Vector3,_float>.x =
                                       (float)(undefined4)local_188;
                                  wi_04.super_Tuple3<pbrt::Vector3,_float>.y =
                                       (float)local_188._4_4_;
                                  FVar19 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>
                                           ::PDF(&local_198,wo_13,wi_04,mode,Transmission);
                                  pPVar14 = pstd::optional<pbrt::PhaseFunctionSample>::value(&ps);
                                  local_168._0_4_ = pPVar14->pdf;
                                  pPVar14 = pstd::optional<pbrt::PhaseFunctionSample>::value(&ps);
                                  FVar20 = Tr(local_130,&pPVar14->wi);
                                  auVar61 = extraout_var_08;
                                  SVar104 = SampledSpectrum::operator*(&beta,FVar20);
                                  auVar97._0_8_ = SVar104.values.values._8_8_;
                                  auVar97._8_56_ = auVar100;
                                  auVar58._0_8_ = SVar104.values.values._0_8_;
                                  auVar58._8_56_ = auVar61;
                                  local_150.values.values =
                                       (array<float,_4>)vmovlhps_avx(auVar58._0_16_,auVar97._0_16_);
                                  auVar61 = ZEXT856(local_150.values.values._8_8_);
                                  SVar104 = SampledSpectrum::operator*(&local_150,&fExit);
                                  auVar98._0_8_ = SVar104.values.values._8_8_;
                                  auVar98._8_56_ = auVar100;
                                  auVar59._0_8_ = SVar104.values.values._0_8_;
                                  auVar59._8_56_ = auVar61;
                                  local_140.values.values =
                                       (array<float,_4>)vmovlhps_avx(auVar59._0_16_,auVar98._0_16_);
                                  auVar61 = ZEXT856(0);
                                  SVar104 = SampledSpectrum::operator*
                                                      (&local_140,
                                                       ((float)local_168._0_4_ *
                                                       (float)local_168._0_4_) /
                                                       (FVar19 * FVar19 +
                                                       (float)local_168._0_4_ *
                                                       (float)local_168._0_4_));
                                  auVar99._0_8_ = SVar104.values.values._8_8_;
                                  auVar99._8_56_ = auVar100;
                                  auVar60._0_8_ = SVar104.values.values._0_8_;
                                  auVar60._8_56_ = auVar61;
                                  local_208.values.values =
                                       (array<float,_4>)vmovlhps_avx(auVar60._0_16_,auVar99._0_16_);
                                  SampledSpectrum::operator+=(&local_d8,&local_208);
                                }
                              }
                              local_168 = ZEXT416((uint)fVar18);
                            }
                          }
                        }
                        pstd::optional<pbrt::PhaseFunctionSample>::~optional(&ps);
                      }
                      else {
                        *(long *)(in_FS_OFFSET + -0x130) = *(long *)(in_FS_OFFSET + -0x130) + 1;
                      }
LAB_0038ee60:
                    }
                  }
                }
              }
            }
            pstd::optional<pbrt::BSDFSample>::~optional(&wis);
          }
        }
      }
    }
    pstd::optional<pbrt::BSDFSample>::~optional(&wos);
    pLVar16 = (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *)
              (ulong)((uint)pLVar16 + 1);
  } while( true );
}

Assistant:

f(Vector3f wo, Vector3f wi, TransportMode mode) const {
        SampledSpectrum f(0.);
        // Estimate _LayeredBxDF_ value _f_ using random sampling
        // Set _wi_ and _wi_ for layered BSDF evaluation
        if (config.twoSided && wo.z < 0) {
            wo = -wo;
            wi = -wi;
        }

        // Determine entrance interface for layered BSDF
        TopOrBottomBxDF<TopBxDF, BottomBxDF> enterInterface;
        bool enteredTop = wo.z > 0;
        if (enteredTop)
            enterInterface = &top;
        else
            enterInterface = &bottom;

        // Determine exit interface and exit $z$ for layered BSDF
        TopOrBottomBxDF<TopBxDF, BottomBxDF> exitInterface, nonExitInterface;
        if (SameHemisphere(wo, wi) ^ enteredTop) {
            exitInterface = &bottom;
            nonExitInterface = &top;
        } else {
            exitInterface = &top;
            nonExitInterface = &bottom;
        }
        Float exitZ = (SameHemisphere(wo, wi) ^ enteredTop) ? 0 : thickness;

        // Account for reflection at the entrance interface
        if (SameHemisphere(wo, wi))
            f = config.nSamples * enterInterface.f(wo, wi, mode);

        // Declare _RNG_ for layered BSDF evaluation
        RNG rng(Hash(GetOptions().seed, wo), Hash(wi));
        auto r = [&rng]() {
            return std::min<Float>(rng.Uniform<Float>(), OneMinusEpsilon);
        };

        for (int s = 0; s < config.nSamples; ++s) {
            // Sample random walk through layers to estimate BSDF value
            // Sample transmission direction through entrance interface
            Float uc = r();
            pstd::optional<BSDFSample> wos = enterInterface.Sample_f(
                wo, uc, Point2f(r(), r()), mode, BxDFReflTransFlags::Transmission);
            if (!wos || !wos->f || wos->pdf == 0 || wos->wi.z == 0)
                continue;

            // Declare state for random walk through BSDF layers
            SampledSpectrum beta = wos->f * AbsCosTheta(wos->wi) / wos->pdf;
            Vector3f w = wos->wi;
            Float z = enteredTop ? thickness : 0;
            HGPhaseFunction phase(g);

            // Sample BSDF for NEE in _wi_'s direction
            uc = r();
            pstd::optional<BSDFSample> wis = exitInterface.Sample_f(
                wi, uc, Point2f(r(), r()), !mode, BxDFReflTransFlags::Transmission);
            if (!wis || !wis->f || wis->pdf == 0 || wis->wi.z == 0)
                continue;

            for (int depth = 0; depth < config.maxDepth; ++depth) {
                // Sample next event for layered BSDF evaluation random walk
                PBRT_DBG("beta: %f %f %f %f, w: %f %f %f, f: %f %f %f %f\n", beta[0],
                         beta[1], beta[2], beta[3], w.x, w.y, w.z, f[0], f[1], f[2],
                         f[3]);
                // Possibly terminate layered BSDF random walk with Russian Roulette
                if (depth > 3 && beta.MaxComponentValue() < 0.25f) {
                    Float q = std::max<Float>(0, 1 - beta.MaxComponentValue());
                    if (r() < q)
                        break;
                    beta /= 1 - q;
                    PBRT_DBG("After RR with q = %f, beta: %f %f %f %f\n", q, beta[0],
                             beta[1], beta[2], beta[3]);
                }

                // Account for media between layers and possibly scatter
                if (!albedo) {
                    // Advance to next layer boundary and update _beta_ for transmittance
                    z = (z == thickness) ? 0 : thickness;
                    beta *= Tr(thickness, w);

                } else {
                    // Sample medium scattering for layered BSDF evaluation
                    Float sigma_t = 1;
                    Float dz = SampleExponential(r(), sigma_t / std::abs(w.z));
                    Float zp = w.z > 0 ? (z + dz) : (z - dz);
                    CHECK_RARE(1e-5, z == zp);
                    if (z == zp)
                        continue;
                    if (0 < zp && zp < thickness) {
                        // Handle scattering event in layered BSDF medium
                        // Account for scattering through _exitInterface_ using _wis_
                        Float wt = 1;
                        if (!IsSpecular(exitInterface.Flags()))
                            wt = PowerHeuristic(1, wis->pdf, 1, phase.PDF(-w, -wis->wi));
                        f += beta * albedo * phase.p(-w, -wis->wi) * wt *
                             Tr(zp - exitZ, wis->wi) * wis->f / wis->pdf;

                        // Sample phase function and update layered path state
                        pstd::optional<PhaseFunctionSample> ps =
                            phase.Sample_p(-w, Point2f(r(), r()));
                        if (!ps || ps->pdf == 0 || ps->wi.z == 0)
                            continue;
                        beta *= albedo * ps->p / ps->pdf;
                        w = ps->wi;
                        z = zp;

                        if (!IsSpecular(exitInterface.Flags())) {
                            // Account for scattering through _exitInterface_ from new _w_
                            SampledSpectrum fExit = exitInterface.f(-w, wi, mode);
                            if (fExit) {
                                Float exitPDF = exitInterface.PDF(
                                    -w, wi, mode, BxDFReflTransFlags::Transmission);
                                Float weight = PowerHeuristic(1, ps->pdf, 1, exitPDF);
                                f += beta * Tr(zp - exitZ, ps->wi) * fExit * weight;
                            }
                        }

                        continue;
                    }
                    z = Clamp(zp, 0, thickness);
                }

                // Account for scattering at appropriate interface
                if (z == exitZ) {
                    // Account for reflection at _exitInterface_
                    Float uc = r();
                    pstd::optional<BSDFSample> bs = exitInterface.Sample_f(
                        -w, uc, Point2f(r(), r()), mode, BxDFReflTransFlags::Reflection);
                    if (!bs || !bs->f || bs->pdf == 0 || bs->wi.z == 0)
                        break;
                    beta *= bs->f * AbsCosTheta(bs->wi) / bs->pdf;
                    w = bs->wi;

                } else {
                    // Account for scattering at _nonExitInterface_
                    if (!IsSpecular(nonExitInterface.Flags())) {
                        // Add NEE contribution along pre-sampled _wis_ direction
                        Float wt = 1;
                        if (!IsSpecular(exitInterface.Flags()))
                            wt = PowerHeuristic(1, wis->pdf, 1,
                                                nonExitInterface.PDF(-w, -wis->wi, mode));
                        f += beta * nonExitInterface.f(-w, -wis->wi, mode) *
                             AbsCosTheta(wis->wi) * wt * Tr(thickness, wis->wi) * wis->f /
                             wis->pdf;
                    }
                    // Sample new direction using BSDF at _nonExitInterface_
                    Float uc = r();
                    Point2f u(r(), r());
                    pstd::optional<BSDFSample> bs = nonExitInterface.Sample_f(
                        -w, uc, u, mode, BxDFReflTransFlags::Reflection);
                    if (!bs || !bs->f || bs->pdf == 0 || bs->wi.z == 0)
                        break;
                    beta *= bs->f * AbsCosTheta(bs->wi) / bs->pdf;
                    w = bs->wi;

                    if (!IsSpecular(exitInterface.Flags())) {
                        // Add NEE contribution along direction from BSDF sample
                        SampledSpectrum fExit = exitInterface.f(-w, wi, mode);
                        if (fExit) {
                            Float wt = 1;
                            if (!IsSpecular(nonExitInterface.Flags())) {
                                Float exitPDF = exitInterface.PDF(
                                    -w, wi, mode, BxDFReflTransFlags::Transmission);
                                wt = PowerHeuristic(1, bs->pdf, 1, exitPDF);
                            }
                            f += beta * Tr(thickness, bs->wi) * fExit * wt;
                        }
                    }
                }
            }
        }

        return f / config.nSamples;
    }